

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void parse_chunk(LexState *ls)

{
  uint8_t *puVar1;
  BCPos *l1;
  ushort uVar2;
  BCLine line;
  BCLine BVar3;
  FuncState *pFVar4;
  BCInsLine *pBVar5;
  GCtab *pGVar6;
  uint3 uVar7;
  bool bVar8;
  uint uVar9;
  LexToken LVar10;
  BCPos BVar11;
  BCPos BVar12;
  BCPos list;
  BCPos BVar13;
  BCReg BVar14;
  BCReg BVar15;
  uint uVar16;
  VarInfo *pVVar17;
  GCstr *pGVar18;
  VarIndex *pVVar19;
  cTValue *pcVar20;
  BCIns ins;
  short sVar21;
  int iVar22;
  FuncState *pFVar23;
  LexState *ls_00;
  undefined4 uVar24;
  uint uVar25;
  ulong uVar26;
  ExpDesc e;
  anon_union_8_3_2ce71dea_for_u local_98;
  MSize local_90;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined8 local_80;
  ulong local_78;
  anon_union_8_3_2ce71dea_for_u local_70;
  MSize local_68;
  undefined1 local_64;
  byte local_63;
  BCLine local_54;
  FuncScope local_50;
  ulong local_40;
  FuncState *local_38;
  
  uVar9 = ls->level + 1;
  ls->level = uVar9;
  if (199 < uVar9) {
    lj_lex_error(ls,0,LJ_ERR_XLEVELS);
  }
  do {
    iVar22 = ls->tok;
    if ((iVar22 - 0x104U < 0x1e) && ((0x20020007U >> (iVar22 - 0x104U & 0x1f) & 1) != 0)) break;
    if (0x14 < iVar22 - 0x102U) {
      if (iVar22 != 0x11d) goto switchD_0012ab44_caseD_104;
      parse_label(ls);
      goto LAB_0012b47a;
    }
    line = ls->linenumber;
    switch(iVar22) {
    case 0x102:
      lj_lex_next(ls);
      parse_break(ls);
      goto LAB_0012b631;
    case 0x103:
      lj_lex_next(ls);
      parse_block(ls);
      lex_match(ls,0x106,0x103,line);
      break;
    default:
switchD_0012ab44_caseD_104:
      pFVar23 = ls->fs;
      expr_primary(ls,(ExpDesc *)&local_98.s);
      if (local_90 == 0xd) {
        *(undefined1 *)((long)&pFVar23->bcbase[(ulong)local_98.sval & 0xffffffff].ins + 3) = 1;
      }
      else {
        local_80 = 0;
        parse_assignment(ls,(LHSVarList *)&local_98.s,1);
      }
      break;
    case 0x108:
      local_38 = ls->fs;
      local_50.nactvar = (uint8_t)local_38->nactvar;
      local_50.flags = '\x01';
      local_50.vstart = local_38->ls->vtop;
      local_50.prev = local_38->bl;
      local_38->bl = &local_50;
      lj_lex_next(ls);
      pGVar18 = lex_str(ls);
      iVar22 = ls->tok;
      if ((iVar22 == 0x2c) || (iVar22 == 0x10c)) {
        pFVar23 = ls->fs;
        local_40 = (ulong)pFVar23->pc;
        local_78 = (ulong)pFVar23->freereg;
        var_new(ls,0,(GCstr *)0x4);
        var_new(ls,1,(GCstr *)0x5);
        var_new(ls,2,(GCstr *)0x6);
        var_new(ls,3,pGVar18);
        uVar9 = 4;
        if (ls->tok == 0x2c) {
          BVar14 = 4;
          do {
            lj_lex_next(ls);
            uVar9 = BVar14 + 1;
            pGVar18 = lex_str(ls);
            var_new(ls,BVar14,pGVar18);
            BVar14 = uVar9;
          } while (ls->tok == 0x2c);
        }
        lex_check(ls,0x10c);
        BVar3 = ls->linenumber;
        BVar14 = expr_list(ls,(ExpDesc *)&local_98.s);
        assign_adjust(ls,3,BVar14,(ExpDesc *)&local_98.s);
        uVar16 = pFVar23->freereg + 3;
        if (pFVar23->framesize < uVar16) {
          if (0xf9 < uVar16) {
            err_syntax(pFVar23->ls,LJ_ERR_XSLOTS);
          }
          pFVar23->framesize = (uint8_t)uVar16;
        }
        local_54 = BVar3;
        if ((uVar9 < 6) && ((uint)local_40 < pFVar23->pc)) {
          uVar16 = pFVar23->bcbase[local_40].ins;
          if ((char)uVar16 == '6') {
            pGVar6 = pFVar23->kt;
            pGVar18 = lj_str_new(ls->L,"pairs",5);
            pcVar20 = lj_tab_getstr(pGVar6,pGVar18);
            if (((pcVar20 == (cTValue *)0x0) || ((pcVar20->field_2).it != 0)) ||
               (uVar24 = (undefined4)CONCAT71((int7)((ulong)pGVar6 >> 8),1),
               (pcVar20->u32).lo != uVar16 >> 0x10)) {
              pGVar6 = pFVar23->kt;
              pGVar18 = lj_str_new(ls->L,"next",4);
              pcVar20 = lj_tab_getstr(pGVar6,pGVar18);
              if (((pcVar20 == (cTValue *)0x0) || ((pcVar20->field_2).it != 0)) ||
                 (uVar24 = (undefined4)CONCAT71((int7)((ulong)pGVar6 >> 8),1),
                 (pcVar20->u32).lo != uVar16 >> 0x10)) goto LAB_0012b71f;
            }
          }
          else {
            if ((uVar16 & 0xff) == 0x2d) {
              pVVar19 = pFVar23->uvmap + (uVar16 >> 0x10);
            }
            else {
              if (((uVar16 & 0xff) != 0x12) || (pFVar23->nactvar <= uVar16 >> 0x10))
              goto LAB_0012b71f;
              pVVar19 = pFVar23->varmap + (uVar16 >> 0x10);
            }
            uVar26 = (ulong)ls->vstack[*pVVar19].name.gcptr32;
            iVar22 = *(int *)(uVar26 + 0xc);
            uVar7 = (uint3)((uint)iVar22 >> 8);
            if (iVar22 == 4) {
              iVar22 = strcmp((char *)(uVar26 + 0x10),"next");
              uVar24 = CONCAT31(uVar7,iVar22 == 0);
            }
            else {
              if ((iVar22 != 5) || (iVar22 = strcmp((char *)(uVar26 + 0x10),"pairs"), iVar22 != 0))
              goto LAB_0012b71f;
              uVar24 = (undefined4)CONCAT71((uint7)uVar7,1);
            }
          }
        }
        else {
LAB_0012b71f:
          uVar24 = 0;
        }
        pFVar4 = ls->fs;
        pVVar17 = ls->vstack;
        BVar13 = pFVar4->pc;
        uVar16 = pFVar4->nactvar;
        iVar22 = 3;
        do {
          uVar2 = pFVar4->varmap[uVar16];
          pVVar17[uVar2].startpc = BVar13;
          pVVar17[uVar2].slot = (uint8_t)uVar16;
          uVar16 = uVar16 + 1;
          pVVar17[uVar2].info = '\0';
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
        pFVar4->nactvar = uVar16;
        lex_check(ls,0x103);
        iVar22 = (int)local_78 * 0x100;
        local_78 = CONCAT44(local_78._4_4_,uVar24);
        BVar13 = bcemit_INS(pFVar23,(uint)(byte)((byte)uVar24 ^ 1) * 0x10 + iVar22 + 0x300 |
                                    0x7fff0048);
        local_64 = (undefined1)pFVar23->nactvar;
        local_63 = 0;
        local_68 = pFVar23->ls->vtop;
        local_70 = (anon_union_8_3_2ce71dea_for_u)pFVar23->bl;
        pFVar23->bl = (FuncScope *)&local_70;
        pFVar4 = ls->fs;
        uVar16 = pFVar4->nactvar;
        BVar14 = uVar9 - 3;
        if (BVar14 != 0) {
          pVVar17 = ls->vstack;
          BVar11 = pFVar4->pc;
          uVar25 = uVar16;
          BVar15 = BVar14;
          do {
            uVar2 = pFVar4->varmap[uVar25];
            uVar16 = uVar25 + 1;
            pVVar17[uVar2].startpc = BVar11;
            pVVar17[uVar2].slot = (uint8_t)uVar25;
            pVVar17[uVar2].info = '\0';
            BVar15 = BVar15 - 1;
            uVar25 = uVar16;
          } while (BVar15 != 0);
        }
        pFVar4->nactvar = uVar16;
        bcreg_reserve(pFVar23,BVar14);
        parse_block(ls);
        fscope_end(pFVar23);
        uVar16 = (pFVar23->pc - BVar13) + 0x7fff;
        if (uVar16 < 0x10000) {
          uVar25 = iVar22 + 0x300;
          *(short *)((long)&pFVar23->bcbase[BVar13].ins + 2) = (short)uVar16;
          bcemit_INS(pFVar23,(uint)(byte)local_78 + uVar9 * 0x1000000 + 0xfe000045 | uVar25 |
                             0x30000);
          BVar11 = bcemit_INS(pFVar23,uVar25 | 0x7fff0052);
          pBVar5 = pFVar23->bcbase;
          pBVar5[BVar11 - 1].line = local_54;
          pBVar5[BVar11].line = local_54;
          sVar21 = (short)(BVar13 - BVar11);
          if ((int)sVar21 == BVar13 - BVar11) {
            *(short *)((long)&pBVar5[BVar11].ins + 2) = sVar21 + -0x8000;
            goto LAB_0012b8ca;
          }
        }
      }
      else {
        if (iVar22 != 0x3d) {
          err_syntax(ls,LJ_ERR_XFOR);
        }
        pFVar23 = ls->fs;
        BVar14 = pFVar23->freereg;
        var_new(ls,0,(GCstr *)0x1);
        var_new(ls,1,(GCstr *)0x2);
        var_new(ls,2,(GCstr *)0x3);
        var_new(ls,3,pGVar18);
        lex_check(ls,0x3d);
        expr_binop(ls,(ExpDesc *)&local_98.s,0);
        expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        lex_check(ls,0x2c);
        expr_binop(ls,(ExpDesc *)&local_98.s,0);
        expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        if (ls->tok == 0x2c) {
          lj_lex_next(ls);
          expr_binop(ls,(ExpDesc *)&local_98.s,0);
          expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        }
        else {
          bcemit_INS(pFVar23,pFVar23->freereg << 8 | 0x10029);
          bcreg_reserve(pFVar23,1);
        }
        pFVar4 = ls->fs;
        pVVar17 = ls->vstack;
        BVar13 = pFVar4->pc;
        uVar9 = pFVar4->nactvar;
        iVar22 = 3;
        do {
          uVar2 = pFVar4->varmap[uVar9];
          pVVar17[uVar2].startpc = BVar13;
          pVVar17[uVar2].slot = (uint8_t)uVar9;
          uVar9 = uVar9 + 1;
          pVVar17[uVar2].info = '\0';
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
        pFVar4->nactvar = uVar9;
        lex_check(ls,0x103);
        uVar16 = BVar14 << 8;
        BVar13 = bcemit_INS(pFVar23,uVar16 | 0x7fff004d);
        local_8c = (undefined1)pFVar23->nactvar;
        local_8b = 0;
        local_90 = pFVar23->ls->vtop;
        local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar23->bl;
        pFVar23->bl = (FuncScope *)&local_98;
        pFVar4 = ls->fs;
        pVVar17 = ls->vstack;
        uVar9 = pFVar4->nactvar;
        uVar2 = pFVar4->varmap[uVar9];
        pVVar17[uVar2].startpc = pFVar4->pc;
        pVVar17[uVar2].slot = (uint8_t)uVar9;
        pVVar17[uVar2].info = '\0';
        pFVar4->nactvar = uVar9 + 1;
        bcreg_reserve(pFVar23,1);
        parse_block(ls);
        fscope_end(pFVar23);
        BVar11 = bcemit_INS(pFVar23,uVar16 | 0x7fff004f);
        pBVar5 = pFVar23->bcbase;
        pBVar5[BVar11].line = line;
        sVar21 = (short)(BVar13 - BVar11);
        if ((int)sVar21 == BVar13 - BVar11) {
          *(short *)((long)&pBVar5[BVar11].ins + 2) = sVar21 + -0x8000;
          uVar9 = (pFVar23->pc - BVar13) + 0x7fff;
          if (uVar9 < 0x10000) {
            *(short *)((long)&pBVar5[BVar13].ins + 2) = (short)uVar9;
LAB_0012b8ca:
            lex_match(ls,0x106,0x108,line);
            pFVar23 = local_38;
            goto LAB_0012b8e6;
          }
        }
      }
      ls_00 = pFVar23->ls;
      goto LAB_0012b950;
    case 0x109:
      lj_lex_next(ls);
      pFVar23 = ls->fs;
      pGVar18 = lex_str(ls);
      var_lookup_(pFVar23,pGVar18,(ExpDesc *)&local_98.s,1);
      while (iVar22 = ls->tok, iVar22 == 0x2e) {
        expr_field(ls,(ExpDesc *)&local_98.s);
      }
      if (iVar22 == 0x3a) {
        expr_field(ls,(ExpDesc *)&local_98.s);
      }
      parse_body(ls,(ExpDesc *)&local_70.s,(uint)(iVar22 == 0x3a),line);
      pFVar23 = ls->fs;
      bcemit_store(pFVar23,(ExpDesc *)&local_98.s,(ExpDesc *)&local_70.s);
      pFVar23->bcbase[pFVar23->pc - 1].line = line;
      break;
    case 0x10a:
      LVar10 = lj_lex_lookahead(ls);
      if (LVar10 != 0x11f) goto switchD_0012ab44_caseD_104;
      lj_lex_next(ls);
      pFVar23 = ls->fs;
      pGVar18 = lex_str(ls);
      pVVar17 = gola_findlabel(ls,pGVar18);
      if (pVVar17 != (VarInfo *)0x0) {
        bcemit_INS(pFVar23,(uint)pVVar17->slot << 8 | 0x7fff0055);
      }
      puVar1 = &pFVar23->bl->flags;
      *puVar1 = *puVar1 | 4;
      BVar13 = bcemit_jmp(pFVar23);
      gola_new(ls,pGVar18,'\x02',BVar13);
      break;
    case 0x10b:
      pFVar23 = ls->fs;
      local_98.s.info = 0xffffffff;
      BVar13 = parse_then(ls);
      l1 = &pFVar23->jpc;
      while (ls->tok == 0x105) {
        BVar11 = bcemit_jmp(pFVar23);
        jmp_append(pFVar23,(BCPos *)&local_98,BVar11);
        pFVar23->lasttarget = pFVar23->pc;
        jmp_append(pFVar23,l1,BVar13);
        BVar13 = parse_then(ls);
      }
      if (ls->tok == 0x104) {
        BVar11 = bcemit_jmp(pFVar23);
        jmp_append(pFVar23,(BCPos *)&local_98,BVar11);
        pFVar23->lasttarget = pFVar23->pc;
        jmp_append(pFVar23,l1,BVar13);
        lj_lex_next(ls);
        parse_block(ls);
      }
      else {
        jmp_append(pFVar23,(BCPos *)&local_98,BVar13);
      }
      pFVar23->lasttarget = pFVar23->pc;
      jmp_append(pFVar23,l1,local_98.s.info);
      lex_match(ls,0x106,0x10b,line);
      goto LAB_0012b8ee;
    case 0x10d:
      lj_lex_next(ls);
      if (ls->tok == 0x109) {
        lj_lex_next(ls);
        pFVar23 = ls->fs;
        pGVar18 = lex_str(ls);
        var_new(ls,0,pGVar18);
        BVar14 = pFVar23->freereg;
        bcreg_reserve(pFVar23,1);
        pFVar4 = ls->fs;
        pVVar17 = ls->vstack;
        uVar9 = pFVar4->nactvar;
        uVar2 = pFVar4->varmap[uVar9];
        pVVar17[uVar2].startpc = pFVar4->pc;
        pVVar17[uVar2].slot = (uint8_t)uVar9;
        pVVar17[uVar2].info = '\0';
        pFVar4->nactvar = uVar9 + 1;
        parse_body(ls,(ExpDesc *)&local_98.s,0,ls->linenumber);
        if ((local_90 == 0xc) && (pFVar23->nactvar <= local_98.s.info)) {
          pFVar23->freereg = pFVar23->freereg - 1;
        }
        expr_toreg(pFVar23,(ExpDesc *)&local_98.s,BVar14);
        ls->vstack[pFVar23->varmap[pFVar23->nactvar - 1]].startpc = pFVar23->pc;
      }
      else {
        pGVar18 = lex_str(ls);
        var_new(ls,0,pGVar18);
        BVar14 = 1;
        if (ls->tok == 0x2c) {
          BVar15 = 1;
          do {
            lj_lex_next(ls);
            BVar14 = BVar15 + 1;
            pGVar18 = lex_str(ls);
            var_new(ls,BVar15,pGVar18);
            BVar15 = BVar14;
          } while (ls->tok == 0x2c);
        }
        if (ls->tok == 0x3d) {
          lj_lex_next(ls);
          BVar15 = expr_list(ls,(ExpDesc *)&local_98.s);
        }
        else {
          local_90 = 0xe;
          BVar15 = 0;
        }
        assign_adjust(ls,BVar14,BVar15,(ExpDesc *)&local_98.s);
        pFVar23 = ls->fs;
        uVar9 = pFVar23->nactvar;
        if (BVar14 != 0) {
          pVVar17 = ls->vstack;
          BVar13 = pFVar23->pc;
          uVar16 = uVar9;
          do {
            uVar2 = pFVar23->varmap[uVar16];
            uVar9 = uVar16 + 1;
            pVVar17[uVar2].startpc = BVar13;
            pVVar17[uVar2].slot = (uint8_t)uVar16;
            pVVar17[uVar2].info = '\0';
            BVar14 = BVar14 - 1;
            uVar16 = uVar9;
          } while (BVar14 != 0);
        }
        pFVar23->nactvar = uVar9;
      }
      break;
    case 0x111:
      pFVar23 = ls->fs;
      uVar9 = pFVar23->pc;
      pFVar23->lasttarget = uVar9;
      local_8c = (undefined1)pFVar23->nactvar;
      local_8b = 1;
      local_90 = pFVar23->ls->vtop;
      local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar23->bl;
      pFVar23->bl = (FuncScope *)&local_98;
      local_63 = 0;
      pFVar23->bl = (FuncScope *)&local_70;
      local_70.sval = (GCstr *)&local_98;
      local_68 = local_90;
      local_64 = local_8c;
      lj_lex_next(ls);
      bcemit_INS(pFVar23,pFVar23->nactvar << 8 | 0x55);
      parse_chunk(ls);
      lex_match(ls,0x115,0x111,line);
      BVar13 = expr_cond(ls);
      if ((local_63 & 8) == 0) {
        fscope_end(pFVar23);
      }
      else {
        parse_break(ls);
        pFVar23->lasttarget = pFVar23->pc;
        jmp_append(pFVar23,&pFVar23->jpc,BVar13);
        fscope_end(pFVar23);
        BVar13 = bcemit_jmp(pFVar23);
      }
      jmp_patch(pFVar23,BVar13,uVar9);
      uVar16 = (pFVar23->pc - uVar9) + 0x7fff;
      if (0xffff < uVar16) {
LAB_0012b945:
        ls_00 = pFVar23->ls;
LAB_0012b950:
        err_syntax(ls_00,LJ_ERR_XJUMP);
      }
      *(short *)((long)&pFVar23->bcbase[uVar9].ins + 2) = (short)uVar16;
LAB_0012b8e6:
      fscope_end(pFVar23);
      goto LAB_0012b8ee;
    case 0x112:
      pFVar23 = ls->fs;
      lj_lex_next(ls);
      pFVar23->flags = pFVar23->flags | 0x20;
      uVar9 = ls->tok - 0x104;
      ins = 0x1004b;
      if ((ls->tok != 0x3b) && ((uVar9 < 0x1e & (byte)(0x20020007 >> ((byte)uVar9 & 0x1f))) == 0)) {
        BVar14 = expr_list(ls,(ExpDesc *)&local_98.s);
        if (BVar14 == 1) {
          if (local_90 == 0xd) {
            if ((char)pFVar23->bcbase[(ulong)local_98.sval & 0xffffffff].ins == 'G')
            goto LAB_0012b44f;
            pFVar23->pc = pFVar23->pc - 1;
            uVar9 = pFVar23->bcbase[(ulong)local_98.sval & 0xffffffff].ins;
            ins = uVar9 & 0xffff00 | (uVar9 & 0xff) + 2;
          }
          else {
            BVar14 = expr_toanyreg(pFVar23,(ExpDesc *)&local_98.s);
            ins = BVar14 << 8 | 0x2004c;
          }
        }
        else if (local_90 == 0xd) {
LAB_0012b44f:
          *(undefined1 *)((long)&pFVar23->bcbase[(ulong)local_98.sval & 0xffffffff].ins + 3) = 0;
          ins = (local_98.s.aux - pFVar23->nactvar) * 0x10000 | pFVar23->nactvar << 8 | 0x49;
        }
        else {
          expr_tonextreg(pFVar23,(ExpDesc *)&local_98.s);
          ins = BVar14 * 0x10000 + 0x1004a | pFVar23->nactvar << 8;
        }
      }
      if ((pFVar23->flags & 1) != 0) {
        bcemit_INS(pFVar23,0x80000032);
      }
      bcemit_INS(pFVar23,ins);
LAB_0012b631:
      bVar8 = false;
      goto LAB_0012b8f5;
    case 0x116:
      pFVar23 = ls->fs;
      lj_lex_next(ls);
      BVar13 = pFVar23->pc;
      pFVar23->lasttarget = BVar13;
      BVar11 = expr_cond(ls);
      local_8c = (undefined1)pFVar23->nactvar;
      local_8b = 1;
      local_90 = pFVar23->ls->vtop;
      local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar23->bl;
      pFVar23->bl = (FuncScope *)&local_98;
      lex_check(ls,0x103);
      BVar12 = bcemit_INS(pFVar23,pFVar23->nactvar << 8 | 0x55);
      parse_block(ls);
      list = bcemit_jmp(pFVar23);
      jmp_patch(pFVar23,list,BVar13);
      lex_match(ls,0x106,0x116,line);
      fscope_end(pFVar23);
      pFVar23->lasttarget = pFVar23->pc;
      jmp_append(pFVar23,&pFVar23->jpc,BVar11);
      uVar9 = (pFVar23->pc - BVar12) + 0x7fff;
      if (0xffff < uVar9) goto LAB_0012b945;
      *(short *)((long)&pFVar23->bcbase[BVar12].ins + 2) = (short)uVar9;
LAB_0012b8ee:
      bVar8 = true;
      goto LAB_0012b8f5;
    }
LAB_0012b47a:
    bVar8 = true;
LAB_0012b8f5:
    if (ls->tok == 0x3b) {
      lj_lex_next(ls);
    }
    ls->fs->freereg = ls->fs->nactvar;
  } while (bVar8);
  ls->level = ls->level - 1;
  return;
}

Assistant:

static void parse_chunk(LexState *ls)
{
  int islast = 0;
  synlevel_begin(ls);
  while (!islast && !parse_isend(ls->tok)) {
    islast = parse_stmt(ls);
    lex_opt(ls, ';');
    lj_assertLS(ls->fs->framesize >= ls->fs->freereg &&
		ls->fs->freereg >= ls->fs->nactvar,
		"bad regalloc");
    ls->fs->freereg = ls->fs->nactvar;  /* Free registers after each stmt. */
  }
  synlevel_end(ls);
}